

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNMachine<char> * __thiscall
Centaurus::CompositeATN<char>::operator[](CompositeATN<char> *this,Identifier *id)

{
  mapped_type *pmVar1;
  Identifier *id_local;
  CompositeATN<char> *this_local;
  
  pmVar1 = std::
           unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<char>_>_>_>
           ::at(&this->m_dict,id);
  return pmVar1;
}

Assistant:

const CATNMachine<TCHAR>& operator[](const Identifier& id) const
    {
        return m_dict.at(id);
    }